

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

bool __thiscall QMenuPrivate::mouseEventTaken(QMenuPrivate *this,QMouseEvent *e)

{
  short sVar1;
  short sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  Data *pDVar7;
  long lVar8;
  QMenuScroller *pQVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  QPoint QVar19;
  QStyle *pQVar20;
  QObject *ptr;
  QWidget *pQVar21;
  undefined8 uVar22;
  QWidget *pQVar23;
  uint uVar24;
  Representation RVar25;
  Representation RVar26;
  long in_FS_OFFSET;
  Representation RStack_12c;
  QPointF local_108;
  QPointF local_f8;
  QMouseEvent new_e;
  Representation RStack_e4;
  undefined8 uStack_e0;
  QPointF local_98;
  QPoint local_80;
  QStyleOption opt;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar23 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  _new_e = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
  opt._0_8_ = QPointF::toPoint((QPointF *)&new_e);
  QVar19 = QWidget::mapFromGlobal(pQVar23,(QPoint *)&opt);
  local_80 = QVar19;
  pQVar20 = QWidget::style(pQVar23);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,0,0);
  QStyleOption::initFrom(&opt,pQVar23);
  iVar12 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x1c,&opt,pQVar23);
  iVar13 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x1d,&opt,pQVar23);
  iVar14 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x1e,&opt);
  if ((this->scroll != (QMenuScroller *)0x0) &&
     (bVar10 = QPointer::operator_cast_to_bool((QPointer *)&this->activeMenu), !bVar10)) {
    if ((-1 < QVar19.xp.m_i.m_i) &&
       (QVar19.xp.m_i.m_i < ((pQVar23->data->crect).x2.m_i - (pQVar23->data->crect).x1.m_i) + 1)) {
      RStack_12c = QVar19.yp.m_i;
      for (uVar24 = 1; uVar24 < 3; uVar24 = uVar24 * 2) {
        if ((uVar24 & this->scroll->scrollFlags) != 0) {
          if (uVar24 == 1) {
            iVar15 = scrollerHeight(this);
            if (RStack_12c.m_i <=
                iVar15 + iVar13 + iVar14 + (int)(this->super_QWidgetPrivate).topmargin) {
LAB_00422818:
              pQVar9 = this->scroll;
              pQVar9->scrollDirection = (quint8)uVar24;
              QBasicTimer::start(&pQVar9->scrollTimer,(Duration)0x2faf080,&pQVar23->super_QObject);
              goto LAB_00422834;
            }
          }
          else {
            iVar15 = (pQVar23->data->crect).y2.m_i;
            iVar17 = (pQVar23->data->crect).y1.m_i;
            iVar16 = scrollerHeight(this);
            if ((iVar15 - ((this->super_QWidgetPrivate).bottommargin + iVar16 +
                          iVar17 + iVar13 + iVar14)) + 1 <= RStack_12c.m_i) goto LAB_00422818;
          }
        }
      }
    }
    QBasicTimer::stop();
  }
  if ((this->field_0x421 & 2) != 0) {
    sVar1 = (this->super_QWidgetPrivate).leftmargin;
    RVar26.m_i = iVar13 + iVar14 + (int)(this->super_QWidgetPrivate).topmargin;
    sVar2 = (this->super_QWidgetPrivate).rightmargin;
    iVar13 = (pQVar23->data->crect).x2.m_i;
    iVar15 = (pQVar23->data->crect).x1.m_i;
    pQVar20 = QWidget::style(pQVar23);
    iVar17 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x1f,&opt);
    RStack_e4.m_i = RVar26.m_i;
    _new_e = (int)sVar1 + iVar12 + iVar14;
    uStack_e0._0_4_ = (iVar13 - (iVar12 + iVar14)) + (-iVar15 - (int)sVar2);
    RVar25.m_i = iVar17 + RVar26.m_i + -1;
    uStack_e0._4_4_ = RVar25.m_i;
    if ((this->scroll != (QMenuScroller *)0x0) && ((this->scroll->scrollFlags & 1) != 0)) {
      iVar12 = scrollerHeight(this);
      RStack_e4.m_i = RVar26.m_i + iVar12;
      uStack_e0._4_4_ = RVar25.m_i + iVar12;
    }
    QWidget::update(pQVar23,(QRect *)&new_e);
    cVar11 = QRect::contains((QPoint *)&new_e,SUB81(&local_80,0));
    if (cVar11 != '\0') {
      local_98 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
      local_f8.xp = (qreal)QPointF::toPoint(&local_98);
      bVar10 = hasMouseMoved(this,(QPoint *)&local_f8);
      if (bVar10) {
        setCurrentAction(this,(QAction *)0x0,-1,SelectedFromElsewhere,false);
        this->field_0x421 = this->field_0x421 | 8;
        if (*(short *)(e + 8) == 3) {
          bVar10 = QPointer::operator_cast_to_bool((QPointer *)&this->tornPopup);
          if (!bVar10) {
            ptr = (QObject *)operator_new(0x28);
            QTornOffMenu::QTornOffMenu((QTornOffMenu *)ptr,(QMenu *)pQVar23);
            QWeakPointer<QObject>::assign<QObject>(&(this->tornPopup).wp,ptr);
          }
          QWidget::setGeometry((QWidget *)(this->tornPopup).wp.value,&pQVar23->data->crect);
          QWidget::show((QWidget *)(this->tornPopup).wp.value);
          hideUpToMenuBar(this);
        }
LAB_00422834:
        bVar10 = true;
        goto LAB_00422837;
      }
    }
    this->field_0x421 = this->field_0x421 & 0xf7;
  }
  _new_e = QWidget::frameGeometry(pQVar23);
  local_98 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
  QVar19 = QPointF::toPoint(&local_98);
  local_f8.xp = (qreal)QVar19;
  bVar10 = false;
  cVar11 = QRect::contains((QPoint *)&new_e,SUB81(&local_f8,0));
  if (cVar11 == '\0') {
    pDVar7 = (this->causedPopup).widget.wp.d;
    if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
      pQVar23 = (QWidget *)0x0;
    }
    else {
      pQVar23 = (QWidget *)(this->causedPopup).widget.wp.value;
    }
LAB_0042260f:
    if (pQVar23 != (QWidget *)0x0) {
      local_98.yp._0_4_ = 0xffffffff;
      local_98.xp = -NAN;
      local_98.yp._4_4_ = 0xffffffff;
      _new_e = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
      local_98 = QWidget::mapFromGlobal(pQVar23,(QPointF *)&new_e);
      pQVar21 = &QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(&pQVar23->super_QObject)->
                 super_QWidget;
      if (pQVar21 == (QWidget *)0x0) {
        pQVar21 = &QtPrivate::qobject_cast_helper<QMenu*,QObject>(&pQVar23->super_QObject)->
                   super_QWidget;
        if (pQVar21 != (QWidget *)0x0) {
          _new_e = QWidget::rect(pQVar21);
          QVar19 = QPointF::toPoint(&local_98);
          local_f8.xp = (qreal)QVar19;
          cVar11 = QRect::contains((QPoint *)&new_e,SUB81(&local_f8,0));
          lVar8 = *(long *)(*(long *)&pQVar21->field_0x8 + 0x2f8);
          if ((lVar8 == 0) || (*(int *)(lVar8 + 4) == 0)) goto LAB_00422694;
          pQVar21 = *(QWidget **)(*(long *)&pQVar21->field_0x8 + 0x300);
          if (cVar11 != '\0') goto LAB_0042269e;
          goto LAB_004226ba;
        }
        goto LAB_0042272e;
      }
      _new_e = QWidget::rect(pQVar21);
      QVar19 = QPointF::toPoint(&local_98);
      local_f8.xp = (qreal)QVar19;
      cVar11 = QRect::contains((QPoint *)&new_e,SUB81(&local_f8,0));
LAB_00422694:
      if (cVar11 == '\0') goto LAB_0042272e;
      pQVar21 = (QWidget *)0x0;
LAB_0042269e:
      sVar1 = *(short *)(e + 8);
      if ((sVar1 == 3) && (&mouseDown->super_QWidget != pQVar23)) goto LAB_004226ba;
      uStack_e0 = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      _new_e = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      pQVar21 = QWidget::window(pQVar23);
      local_f8 = QWidget::mapTo(pQVar23,pQVar21,&local_98);
      local_108 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
      uVar3 = *(undefined4 *)(e + 0x20);
      uVar4 = *(undefined4 *)(e + 0x40);
      uVar5 = *(undefined4 *)(e + 0x44);
      uVar18 = QMouseEvent::source();
      uVar22 = QPointerEvent::pointingDevice();
      QMouseEvent::QMouseEvent
                (&new_e,sVar1,&local_98,&local_f8,&local_108,uVar4,uVar5,uVar3,uVar18,uVar22);
      QCoreApplication::sendEvent(&pQVar23->super_QObject,(QEvent *)&new_e);
      QMouseEvent::~QMouseEvent(&new_e);
      goto LAB_00422834;
    }
    bVar10 = false;
  }
LAB_00422837:
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return bVar10;
LAB_004226ba:
  pQVar23 = pQVar21;
  if (pQVar21 == (QWidget *)0x0) {
LAB_0042272e:
    QMenuSloppyState::leave(&this->sloppyState);
    pQVar23 = (QWidget *)0x0;
  }
  goto LAB_0042260f;
}

Assistant:

bool QMenuPrivate::mouseEventTaken(QMouseEvent *e)
{
    Q_Q(QMenu);
    QPoint pos = q->mapFromGlobal(e->globalPosition().toPoint());

    QStyle *style = q->style();
    QStyleOption opt(0);
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q);
    const int vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);

    if (scroll && !activeMenu) { //let the scroller "steal" the event
        bool isScroll = false;
        if (pos.x() >= 0 && pos.x() < q->width()) {
        for (int dir = QMenuScroller::ScrollUp; dir <= QMenuScroller::ScrollDown; dir = dir << 1) {
                if (scroll->scrollFlags & dir) {
                    if (dir == QMenuScroller::ScrollUp)
                        isScroll = (pos.y() <= scrollerHeight() + fw + vmargin + topmargin);
                    else if (dir == QMenuScroller::ScrollDown)
                        isScroll = (pos.y() >= q->height() - scrollerHeight() - fw - vmargin - bottommargin);
                    if (isScroll) {
                        scroll->scrollDirection = dir;
                        break;
                    }
                }
            }
        }
        if (isScroll) {
            scroll->scrollTimer.start(50, q);
            return true;
        } else {
            scroll->scrollTimer.stop();
        }
    }

    if (tearoff) { //let the tear off thingie "steal" the event..
        QRect tearRect(leftmargin + hmargin + fw, topmargin + vmargin + fw, q->width() - fw * 2 - hmargin * 2 -leftmargin - rightmargin,
                       q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q));
        if (scroll && scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            tearRect.translate(0, scrollerHeight());
        q->update(tearRect);
        if (tearRect.contains(pos) && hasMouseMoved(e->globalPosition().toPoint())) {
            setCurrentAction(nullptr);
            tearoffHighlighted = 1;
            if (e->type() == QEvent::MouseButtonRelease) {
                if (!tornPopup)
                    tornPopup = new QTornOffMenu(q);
                tornPopup->setGeometry(q->geometry());
                tornPopup->show();
                hideUpToMenuBar();
            }
            return true;
        }
        tearoffHighlighted = 0;
    }

    if (q->frameGeometry().contains(e->globalPosition().toPoint()))
        return false; //otherwise if the event is in our rect we want it..

    for(QWidget *caused = causedPopup.widget; caused;) {
        bool passOnEvent = false;
        QWidget *next_widget = nullptr;
        QPointF cpos = caused->mapFromGlobal(e->globalPosition());
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
            passOnEvent = mb->rect().contains(cpos.toPoint());
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(caused)) {
            passOnEvent = m->rect().contains(cpos.toPoint());
            next_widget = m->d_func()->causedPopup.widget;
        }
        if (passOnEvent) {
            if (e->type() != QEvent::MouseButtonRelease || mouseDown == caused) {
                QMouseEvent new_e(e->type(), cpos, caused->mapTo(caused->topLevelWidget(), cpos), e->globalPosition(),
                                  e->button(), e->buttons(), e->modifiers(),
                                  e->source(), e->pointingDevice());
                QCoreApplication::sendEvent(caused, &new_e);
                return true;
            }
        }
        caused = next_widget;
        if (!caused)
            sloppyState.leave(); // Start timers
    }
    return false;
}